

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O0

int bomb_destroy_ship_proc(Am_Object *self)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  int local_4c;
  int local_48;
  int ship_bottom;
  int ship_right;
  int ship_top;
  int ship_left;
  int bomb_right;
  int bomb_left;
  int bomb_bottom;
  int bomb_top;
  Am_Object local_20;
  Am_Object *local_18;
  Am_Object *self_local;
  
  local_18 = self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid();
  Am_Object::~Am_Object(&local_20);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_18,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar5);
    if (bVar2) {
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_18,0x65);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      bomb_left = iVar3;
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_18,0x67);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      bomb_right = iVar3 + iVar4;
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_18,100);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      ship_left = iVar3;
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_18,0x66);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      ship_top = iVar3 + iVar4;
      pAVar5 = (Am_Value *)Am_Object::Get(0xb2c8,100);
      ship_right = Am_Value::operator_cast_to_int(pAVar5);
      pAVar5 = (Am_Value *)Am_Object::Get(0xb2c8,0x65);
      ship_bottom = Am_Value::operator_cast_to_int(pAVar5);
      iVar4 = ship_right;
      pAVar5 = (Am_Value *)Am_Object::Get(0xb2c8,0x66);
      local_48 = Am_Value::operator_cast_to_int(pAVar5);
      iVar3 = ship_bottom;
      local_48 = iVar4 + local_48;
      pAVar5 = (Am_Value *)Am_Object::Get(0xb2c8,0x67);
      local_4c = Am_Value::operator_cast_to_int(pAVar5);
      local_4c = iVar3 + local_4c;
      if ((((ship_right <= ship_left) && (ship_left <= local_48)) ||
          ((ship_right <= ship_top && (ship_top <= local_48)))) &&
         (((bomb_left <= local_4c && (ship_bottom <= bomb_left)) ||
          ((bomb_right <= local_4c && (ship_bottom <= bomb_right)))))) {
        Am_Object::Set(0xb2c8,true,0);
        Am_Object::Set((ushort)local_18,true,0);
        Am_Object::Am_Object(&local_58,local_18);
        blot_bomb(&local_58);
        Am_Object::~Am_Object(&local_58);
        Am_Object::Am_Object(&local_60,&alien_animator);
        Am_Stop_Animator((Am_Object_Data *)&local_60);
        Am_Object::~Am_Object(&local_60);
        Am_Object::Am_Object(&local_68,&star_animator);
        Am_Stop_Animator((Am_Object_Data *)&local_68);
        Am_Object::~Am_Object(&local_68);
      }
    }
  }
  return 0;
}

Assistant:

Am_Define_Formula(int, bomb_destroy_ship) // in the bomb, not its group
{
  if (!self.Get_Owner().Valid())
    return 0;
  if (!(bool)self.Get(Am_VISIBLE))
    return 0;

  int bomb_top = (int)self.Get(Am_TOP);
  int bomb_bottom = bomb_top + (int)self.Get(Am_HEIGHT);
  int bomb_left = (int)self.Get(Am_LEFT);
  int bomb_right = bomb_left + (int)self.Get(Am_WIDTH);
  int ship_left = (int)Ship.Get(Am_LEFT);
  int ship_top = (int)Ship.Get(Am_TOP);
  int ship_right = ship_left + (int)Ship.Get(Am_WIDTH);
  int ship_bottom = ship_top + (int)Ship.Get(Am_HEIGHT);
  if (((bomb_left >= ship_left && bomb_left <= ship_right) ||
       (bomb_right >= ship_left && bomb_right <= ship_right)) &&
      ((bomb_top <= ship_bottom && bomb_top >= ship_top) ||
       (bomb_bottom <= ship_bottom && bomb_bottom >= ship_top))) {
    Ship.Set(Am_VISIBLE, false);
    self.Set(Am_VISIBLE, false);
    blot_bomb(self);
    Am_Stop_Animator(alien_animator);
    Am_Stop_Animator(star_animator);
  }
  return 0;
}